

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

VSubst<8UL> * __thiscall GF2::VSubst<8UL>::Rand(VSubst<8UL> *this)

{
  VSubst<8UL> *in_RDI;
  VSubst<8UL> *unaff_retaddr;
  word x;
  VSubst<8UL> *in_stack_ffffffffffffffe0;
  word y;
  VSubst<8UL> *x_00;
  
  x_00 = in_RDI;
  First(in_stack_ffffffffffffffe0);
  for (y = 0x100; y != 0; y = y - 1) {
    Env::Rand();
    Transpose(unaff_retaddr,(word)x_00,y);
  }
  return in_RDI;
}

Assistant:

VSubst& Rand()
	{
		First();
		for (word x = _size; x != 0; x--)
			Transpose(x - 1, Env::Rand() % x);
		return *this;
	}